

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_> *
__thiscall
Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>
       *__return_storage_ptr__,
      Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
      *this)

{
  BacktrackData ***pppBVar1;
  int iVar2;
  TermList t;
  char cVar3;
  bool bVar4;
  void **head;
  TermWithValue<Kernel::Literal_*> *pTVar5;
  BacktrackData **ppBVar6;
  Renaming normalizer;
  ResultSubstitution local_60;
  RefCounter *local_58;
  Renaming local_50;
  
  do {
    if ((this->_leafData).
        super_OptionBase<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>_>.
        _isSome == true) {
      cVar3 = (**(code **)(*(long *)(this->_leafData).
                                    super_OptionBase<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>_>
                                    ._elem._elem + 0x10))();
      if (cVar3 != '\0') break;
    }
    bVar4 = findNextLeaf(this);
  } while (bVar4);
  pTVar5 = (TermWithValue<Kernel::Literal_*> *)
           (**(code **)(*(long *)(this->_leafData).
                                 super_OptionBase<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>_>
                                 ._elem._elem + 0x18))();
  if (this->_retrieveSubstitution == true) {
    local_50._data._timestamp = 1;
    local_50._data._size = 0;
    local_50._data._deleted = 0;
    local_50._data._capacityIndex = 0;
    local_50._data._capacity = 0;
    local_50._data._20_8_ = 0;
    local_50._data._28_8_ = 0;
    local_50._36_8_ = 0;
    local_50._identity = true;
    t._content = (pTVar5->term)._sort._content;
    Kernel::Renaming::normalizeVariables(&local_50,(TermList)(pTVar5->term).super_TermList._content)
    ;
    Kernel::Renaming::normalizeVariables(&local_50,t);
    ppBVar6 = (this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    if (ppBVar6 == (this->_algo)._subs.super_Backtrackable._bdStack._end) {
      Lib::Stack<Lib::BacktrackData_*>::expand((Stack<Lib::BacktrackData_*> *)this);
      ppBVar6 = (this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    }
    *ppBVar6 = &this->_normalizationBacktrackData;
    pppBVar1 = &(this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    *pppBVar1 = *pppBVar1 + 1;
    this->_normalizationRecording = true;
    Kernel::RobSubstitution::denormalize((RobSubstitution *)this,&local_50,2,1);
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
              (&local_50._data);
  }
  ResultSubstitution::fromSubstitution(&local_60,(RobSubstitution *)this,0,1);
  (__return_storage_ptr__->unifier)._obj = (ResultSubstitution *)local_60._vptr_ResultSubstitution;
  (__return_storage_ptr__->unifier)._refCnt = local_58;
  if (local_58 == (RefCounter *)0x0 ||
      (ResultSubstitution *)local_60._vptr_ResultSubstitution == (ResultSubstitution *)0x0) {
    __return_storage_ptr__->data = pTVar5;
  }
  else {
    iVar2 = local_58->_val;
    __return_storage_ptr__->data = pTVar5;
    local_58->_val = iVar2;
    if (iVar2 == 0) {
      (**(_func_int **)((long)*local_60._vptr_ResultSubstitution + 8))();
      if (local_58 != (RefCounter *)0x0) {
        *(undefined8 *)local_58 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }